

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleForth.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  string res2;
  string line;
  string str;
  ifstream t;
  Forth forth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  string local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38 [7];
  undefined8 auStack_950 [36];
  undefined1 local_830 [1512];
  undefined8 local_248;
  bool local_214;
  
  cppforth::Forth::Forth((Forth *)local_830);
  local_a38[0]._M_dataplus._M_p = (pointer)&local_a38[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"");
  std::__cxx11::stringbuf::str((string *)(local_830 + 0x338));
  std::ios::clear((int)local_830 + 800 + (int)*(undefined8 *)(local_830._800_8_ + -0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38[0]._M_dataplus._M_p != &local_a38[0].field_2) {
    operator_delete(local_a38[0]._M_dataplus._M_p,local_a38[0].field_2._M_allocated_capacity + 1);
  }
  local_248._0_4_ = FromStdCin;
  local_248._4_4_ = ToStdCout;
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a98," ","");
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  local_ab8._M_string_length = 0;
  local_ab8.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    uVar3 = 1;
    do {
      std::ifstream::ifstream(local_a38,argv[uVar3],_S_in);
      local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_a78,
                 *(undefined8 *)
                  ((long)auStack_950 + *(long *)(local_a38[0]._M_dataplus._M_p + -0x18)),0xffffffff,
                 0,0xffffffff);
      cppforth::Forth::SetInput((Forth *)local_830,&local_a78);
      cppforth::Forth::interpret((Forth *)local_830);
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_ab8,&local_a58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
        operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
      }
      cppforth::Forth::ExecutionOutputReset((Forth *)local_830);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
        operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
      }
      std::ifstream::~ifstream(local_a38);
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  if (local_214 == false) {
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,">",1);
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_a98,cVar1);
      cppforth::Forth::SetInput((Forth *)local_830,&local_a98);
      cppforth::Forth::interpret((Forth *)local_830);
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_ab8,local_a38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a38[0]._M_dataplus._M_p != &local_a38[0].field_2) {
        operator_delete(local_a38[0]._M_dataplus._M_p,local_a38[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_ab8._M_dataplus._M_p,local_ab8._M_string_length);
      cppforth::Forth::ExecutionOutputReset((Forth *)local_830);
      local_ab8._M_string_length = 0;
      *local_ab8._M_dataplus._M_p = '\0';
    } while (local_214 == false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,
                    CONCAT71(local_ab8.field_2._M_allocated_capacity._1_7_,
                             local_ab8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  cppforth::Forth::~Forth((Forth *)local_830);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
	try {
		cppforth::Forth forth{};
		forth.SetExecutionInputBuffer("");
		forth.setInputSource(cppforth::Forth::FromStdCin);
		forth.setWriteTarget(cppforth::Forth::ToStdCout);

		std::string line{ " " }, res2{};
		for(int i=1;i<argc;++i){
			std::ifstream t(argv[i]);
                        std::string str((std::istreambuf_iterator<char>(t)),
                         std::istreambuf_iterator<char>());
			forth.ExecuteString(str);
			res2 = forth.ExecutionOutput();
			forth.ExecutionOutputReset();
		}
		while (!forth.isFinished()){
			std::cout << std::endl << ">" ;
 			std::getline(std::cin, line);
			try {
				forth.ExecuteString(line);
				res2 = forth.ExecutionOutput();
				std::cout << res2;
			}
			catch (cppforth::Forth::AbortException &ex){
				const char *errorMessage = ex.what();
				std::cout << "Forth exception " << errorMessage << std::endl;
			}
			forth.ExecutionOutputReset();
			res2.clear();
		}
	}
	catch (cppforth::Forth::AbortException &ex){
		const char *errorMessage = ex.what();
         	std::cout << "Forth exception "<<errorMessage<<std::endl;
	}
	catch (std::exception &ex){
		const char *errorMessage = ex.what();
         	std::cout << "C++ exception "<<errorMessage<<std::endl;
	}
	catch (...){
         	std::cout << "Unknown C++ exception "<<std::endl;
	}
	return 0;
}